

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_type.cpp
# Opt level: O3

CatalogType duckdb::CatalogTypeFromString(string *type)

{
  pointer pcVar1;
  CatalogType CVar2;
  int iVar3;
  InternalException *this;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar3 = ::std::__cxx11::string::compare((char *)type);
  if (iVar3 == 0) {
    CVar2 = COLLATION_ENTRY;
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)type);
    if (iVar3 == 0) {
      CVar2 = TYPE_ENTRY;
    }
    else {
      iVar3 = ::std::__cxx11::string::compare((char *)type);
      if (iVar3 == 0) {
        CVar2 = TABLE_ENTRY;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)type);
        if (iVar3 == 0) {
          CVar2 = SCHEMA_ENTRY;
        }
        else {
          iVar3 = ::std::__cxx11::string::compare((char *)type);
          if (iVar3 == 0) {
            CVar2 = DATABASE_ENTRY;
          }
          else {
            iVar3 = ::std::__cxx11::string::compare((char *)type);
            if (iVar3 == 0) {
              CVar2 = TABLE_FUNCTION_ENTRY;
            }
            else {
              iVar3 = ::std::__cxx11::string::compare((char *)type);
              if (iVar3 == 0) {
                CVar2 = SCALAR_FUNCTION_ENTRY;
              }
              else {
                iVar3 = ::std::__cxx11::string::compare((char *)type);
                if (iVar3 == 0) {
                  CVar2 = AGGREGATE_FUNCTION_ENTRY;
                }
                else {
                  iVar3 = ::std::__cxx11::string::compare((char *)type);
                  if (iVar3 == 0) {
                    CVar2 = COPY_FUNCTION_ENTRY;
                  }
                  else {
                    iVar3 = ::std::__cxx11::string::compare((char *)type);
                    if (iVar3 == 0) {
                      CVar2 = PRAGMA_FUNCTION_ENTRY;
                    }
                    else {
                      iVar3 = ::std::__cxx11::string::compare((char *)type);
                      if (iVar3 == 0) {
                        CVar2 = MACRO_ENTRY;
                      }
                      else {
                        iVar3 = ::std::__cxx11::string::compare((char *)type);
                        if (iVar3 == 0) {
                          CVar2 = TABLE_MACRO_ENTRY;
                        }
                        else {
                          iVar3 = ::std::__cxx11::string::compare((char *)type);
                          if (iVar3 == 0) {
                            CVar2 = VIEW_ENTRY;
                          }
                          else {
                            iVar3 = ::std::__cxx11::string::compare((char *)type);
                            if (iVar3 == 0) {
                              CVar2 = INDEX_ENTRY;
                            }
                            else {
                              iVar3 = ::std::__cxx11::string::compare((char *)type);
                              if (iVar3 == 0) {
                                CVar2 = PREPARED_STATEMENT;
                              }
                              else {
                                iVar3 = ::std::__cxx11::string::compare((char *)type);
                                if (iVar3 == 0) {
                                  CVar2 = SEQUENCE_ENTRY;
                                }
                                else {
                                  iVar3 = ::std::__cxx11::string::compare((char *)type);
                                  if (iVar3 != 0) {
                                    this = (InternalException *)__cxa_allocate_exception(0x10);
                                    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_68,"Unrecognized CatalogType \'%s\'"
                                               ,"");
                                    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
                                    pcVar1 = (type->_M_dataplus)._M_p;
                                    ::std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_48,pcVar1,
                                               pcVar1 + type->_M_string_length);
                                    InternalException::InternalException<std::__cxx11::string>
                                              (this,&local_68,&local_48);
                                    __cxa_throw(this,&InternalException::typeinfo,
                                                ::std::runtime_error::~runtime_error);
                                  }
                                  CVar2 = INVALID;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CatalogType CatalogTypeFromString(const string &type) {
	if (type == "Collation") {
		return CatalogType::COLLATION_ENTRY;
	}
	if (type == "Type") {
		return CatalogType::TYPE_ENTRY;
	}
	if (type == "Table") {
		return CatalogType::TABLE_ENTRY;
	}
	if (type == "Schema") {
		return CatalogType::SCHEMA_ENTRY;
	}
	if (type == "Database") {
		return CatalogType::DATABASE_ENTRY;
	}
	if (type == "Table Function") {
		return CatalogType::TABLE_FUNCTION_ENTRY;
	}
	if (type == "Scalar Function") {
		return CatalogType::SCALAR_FUNCTION_ENTRY;
	}
	if (type == "Aggregate Function") {
		return CatalogType::AGGREGATE_FUNCTION_ENTRY;
	}
	if (type == "Copy Function") {
		return CatalogType::COPY_FUNCTION_ENTRY;
	}
	if (type == "Pragma Function") {
		return CatalogType::PRAGMA_FUNCTION_ENTRY;
	}
	if (type == "Macro Function") {
		return CatalogType::MACRO_ENTRY;
	}
	if (type == "Table Macro Function") {
		return CatalogType::TABLE_MACRO_ENTRY;
	}
	if (type == "View") {
		return CatalogType::VIEW_ENTRY;
	}
	if (type == "Index") {
		return CatalogType::INDEX_ENTRY;
	}
	if (type == "Prepared Statement") {
		return CatalogType::PREPARED_STATEMENT;
	}
	if (type == "Sequence") {
		return CatalogType::SEQUENCE_ENTRY;
	}
	if (type == "INVALID") {
		return CatalogType::INVALID;
	}
	throw InternalException("Unrecognized CatalogType '%s'", type);
}